

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall
MakefileGenerator::createSedArgs(MakefileGenerator *this,ProKey *replace_rule,QString *file_name)

{
  bool bVar1;
  QList<ProString> *this_00;
  QStringBuilder<const_char_(&)[5],_QString> *b;
  qsizetype qVar2;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int r;
  ProStringList *replace_rules;
  QString *sedargs;
  ProString filename;
  ProString replace;
  ProString match;
  undefined7 in_stack_fffffffffffffb48;
  byte in_stack_fffffffffffffb4f;
  byte bVar3;
  QMakeProject *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb58;
  byte in_stack_fffffffffffffb5f;
  ProKey *in_stack_fffffffffffffb60;
  ProString *this_01;
  QMakeProject *in_stack_fffffffffffffb68;
  ProString *this_02;
  undefined7 in_stack_fffffffffffffb80;
  byte local_457;
  int local_454;
  ProString local_130;
  QStringBuilder<const_ProString_&,_const_char_(&)[9]> local_100;
  undefined1 local_c0 [48];
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_90;
  ProString local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QString::QString((QString *)0x18b7cd);
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  local_457 = 0;
  if (!bVar1) {
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                     *(char **)(in_RSI + 0xd8));
    bVar1 = QMakeProject::isActiveConfig
                      ((QMakeProject *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58)
                       ,(QString *)in_stack_fffffffffffffb50,(bool)in_stack_fffffffffffffb4f);
    local_457 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x18b85a);
  }
  if ((local_457 & 1) != 0) {
    this_00 = &QMakeProject::values
                         (in_stack_fffffffffffffb50,
                          (ProKey *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48))->
               super_QList<ProString>;
    local_454 = 0;
    while( true ) {
      b = (QStringBuilder<const_char_(&)[5],_QString> *)(long)local_454;
      qVar2 = QList<ProString>::size(this_00);
      if (qVar2 <= (long)b) break;
      memset(&local_50,0xaa,0x30);
      this_01 = *(ProString **)(in_RSI + 0xd8);
      QList<ProString>::at
                ((QList<ProString> *)in_stack_fffffffffffffb50,
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      local_90 = ::operator+((ProString *)in_stack_fffffffffffffb50,
                             (char (*) [7])
                             CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      ProKey::ProKey<ProString_const&,char_const(&)[7]>
                ((ProKey *)in_stack_fffffffffffffb50,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      QMakeEvaluator::first(&in_stack_fffffffffffffb68->super_QMakeEvaluator,(ProKey *)this_01);
      ProKey::~ProKey((ProKey *)0x18b953);
      memset(local_c0,0xaa,0x30);
      in_stack_fffffffffffffb68 = *(QMakeProject **)(in_RSI + 0xd8);
      QList<ProString>::at
                ((QList<ProString> *)in_stack_fffffffffffffb50,
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      local_100 = ::operator+((ProString *)in_stack_fffffffffffffb50,
                              (char (*) [9])
                              CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      ProKey::ProKey<ProString_const&,char_const(&)[9]>
                ((ProKey *)in_stack_fffffffffffffb50,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      QMakeEvaluator::first(&in_stack_fffffffffffffb68->super_QMakeEvaluator,(ProKey *)this_01);
      ProKey::~ProKey((ProKey *)0x18b9e5);
      memset(&local_130,0xaa,0x30);
      this_02 = *(ProString **)(in_RSI + 0xd8);
      QList<ProString>::at
                ((QList<ProString> *)in_stack_fffffffffffffb50,
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      ::operator+((ProString *)in_stack_fffffffffffffb50,
                  (char (*) [10])CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      ProKey::ProKey<ProString_const&,char_const(&)[10]>
                ((ProKey *)in_stack_fffffffffffffb50,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)
                 CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
      QMakeEvaluator::first(&in_stack_fffffffffffffb68->super_QMakeEvaluator,(ProKey *)this_01);
      ProKey::~ProKey((ProKey *)0x18ba77);
      bVar1 = ProString::isEmpty(&local_50);
      if ((!bVar1) &&
         ((bVar1 = ProString::isEmpty(&local_130), bVar3 = in_stack_fffffffffffffb4f, bVar1 ||
          (bVar1 = ProString::operator==(this_02,(QString *)in_stack_fffffffffffffb68),
          bVar3 = in_stack_fffffffffffffb4f, bVar1)))) {
        ::operator+((char (*) [3])in_stack_fffffffffffffb50,
                    (ProString *)CONCAT17(bVar3,in_stack_fffffffffffffb48));
        ::operator+((QStringBuilder<const_char_(&)[3],_const_ProString_&> *)
                    in_stack_fffffffffffffb50,
                    (char (*) [2])CONCAT17(bVar3,in_stack_fffffffffffffb48));
        ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>
                     *)in_stack_fffffffffffffb50,
                    (ProString *)CONCAT17(bVar3,in_stack_fffffffffffffb48));
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>
                     *)in_stack_fffffffffffffb50,
                    (char (*) [3])CONCAT17(bVar3,in_stack_fffffffffffffb48));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[3]>
                    *)CONCAT17(bVar3,in_stack_fffffffffffffb48));
        shellQuote((MakefileGenerator *)
                   CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                   (QString *)in_stack_fffffffffffffb50);
        ::operator+((char (*) [5])CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                    (QString *)in_stack_fffffffffffffb50);
        ::operator+=((QString *)CONCAT17(local_457,in_stack_fffffffffffffb80),b);
        QStringBuilder<const_char_(&)[5],_QString>::~QStringBuilder
                  ((QStringBuilder<const_char_(&)[5],_QString> *)0x18bb9b);
        QString::~QString((QString *)0x18bba8);
        QString::~QString((QString *)0x18bbb5);
        bVar1 = isWindowsShell((MakefileGenerator *)
                               CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
        in_stack_fffffffffffffb4f = 0;
        in_stack_fffffffffffffb5f = in_stack_fffffffffffffb4f;
        if (bVar1) {
          in_stack_fffffffffffffb50 = *(QMakeProject **)(in_RSI + 0xd8);
          QList<ProString>::at
                    ((QList<ProString> *)in_stack_fffffffffffffb50,
                     CONCAT17(bVar3,in_stack_fffffffffffffb48));
          ::operator+((ProString *)in_stack_fffffffffffffb50,
                      (char (*) [8])CONCAT17(bVar3,in_stack_fffffffffffffb48));
          ProKey::ProKey<ProString_const&,char_const(&)[8]>
                    ((ProKey *)in_stack_fffffffffffffb50,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
                     CONCAT17(bVar3,in_stack_fffffffffffffb48));
          QMakeEvaluator::first(&in_stack_fffffffffffffb68->super_QMakeEvaluator,(ProKey *)this_01);
          in_stack_fffffffffffffb4f =
               ProString::contains(this_01,(char *)CONCAT17(in_stack_fffffffffffffb4f,
                                                            in_stack_fffffffffffffb58),
                                   (CaseSensitivity)((ulong)in_stack_fffffffffffffb50 >> 0x20));
          in_stack_fffffffffffffb5f = in_stack_fffffffffffffb4f;
          ProString::~ProString((ProString *)0x18bc8e);
          ProKey::~ProKey((ProKey *)0x18bca4);
        }
        if ((in_stack_fffffffffffffb4f & 1) != 0) {
          ProString::toQString
                    ((ProString *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          windowsifyPath(&this_01->m_string);
          ::operator+((char (*) [3])CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                      (QString *)in_stack_fffffffffffffb50);
          ::operator+((QStringBuilder<const_char_(&)[3],_QString> *)
                      CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                      (char (*) [2])in_stack_fffffffffffffb50);
          ProString::toQString
                    ((ProString *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          windowsifyPath(&this_01->m_string);
          ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>
                       *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                      (QString *)in_stack_fffffffffffffb50);
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
                       *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                      (char (*) [4])in_stack_fffffffffffffb50);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
                      *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          shellQuote((MakefileGenerator *)
                     CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                     (QString *)in_stack_fffffffffffffb50);
          ::operator+((char (*) [5])CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                      (QString *)in_stack_fffffffffffffb50);
          ::operator+=((QString *)CONCAT17(local_457,in_stack_fffffffffffffb80),b);
          QStringBuilder<const_char_(&)[5],_QString>::~QStringBuilder
                    ((QStringBuilder<const_char_(&)[5],_QString> *)0x18bde0);
          QString::~QString((QString *)0x18bded);
          QString::~QString((QString *)0x18bdfa);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
                             *)0x18be07);
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
                             *)in_stack_fffffffffffffb50);
          QString::~QString((QString *)0x18be21);
          QString::~QString((QString *)0x18be2e);
          QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>::
          ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>
                           *)0x18be3b);
          QStringBuilder<const_char_(&)[3],_QString>::~QStringBuilder
                    ((QStringBuilder<const_char_(&)[3],_QString> *)0x18be48);
          QString::~QString((QString *)0x18be55);
          QString::~QString((QString *)0x18be62);
        }
      }
      ProString::~ProString((ProString *)0x18be71);
      ProString::~ProString((ProString *)0x18be7e);
      ProString::~ProString((ProString *)0x18be8b);
      local_454 = local_454 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::createSedArgs(const ProKey &replace_rule, const QString &file_name) const
{
    QString sedargs;
    if (!project->isEmpty(replace_rule) && !project->isActiveConfig("no_sed_meta_install")) {
        const ProStringList &replace_rules = project->values(replace_rule);
        for (int r = 0; r < replace_rules.size(); ++r) {
            const ProString match = project->first(ProKey(replace_rules.at(r) + ".match")),
                            replace = project->first(ProKey(replace_rules.at(r) + ".replace")),
                            filename = project->first(ProKey(replace_rules.at(r) + ".filename"));
            if (!match.isEmpty() /*&& match != replace*/
                && (filename.isEmpty() || filename == file_name)) {
                sedargs += " -e " + shellQuote("s," + match + "," + replace + ",g");
                if (isWindowsShell()
                    && project->first(ProKey(replace_rules.at(r) + ".CONFIG")).contains("path"))
                    sedargs += " -e "
                            + shellQuote("s," + windowsifyPath(match.toQString()) + ","
                                         + windowsifyPath(replace.toQString()) + ",gi");
            }
        }
    }
    return sedargs;
}